

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cmds.cpp
# Opt level: O3

void Cmd_nextsecret(FCommandLine *argv,APlayerPawn *who,int key)

{
  FString mapname;
  int iVar1;
  char *format;
  
  mapname.Chars = level.NextSecretMap.Chars;
  if (netgame) {
    format = "Use \x1c+changemap\x1c- instead. \x1c+Nextsecret\x1c- is for single-player only.\n";
  }
  else {
    if (*(int *)(level.NextSecretMap.Chars + -0xc) != 0) {
      iVar1 = strncmp(level.NextSecretMap.Chars,"enDSeQ",6);
      if (iVar1 != 0) {
        G_DeferedInitNew(mapname.Chars,-1);
        return;
      }
    }
    format = "no next secret map!\n";
  }
  Printf(format);
  return;
}

Assistant:

CCMD(nextsecret)
{
	if (netgame)
	{
		Printf ("Use " TEXTCOLOR_BOLD "changemap" TEXTCOLOR_NORMAL " instead. " TEXTCOLOR_BOLD "Nextsecret"
				TEXTCOLOR_NORMAL " is for single-player only.\n");
		return;
	}

	if (level.NextSecretMap.Len() > 0 && level.NextSecretMap.Compare("enDSeQ", 6))
	{
		G_DeferedInitNew(level.NextSecretMap);
	}
	else
	{
		Printf("no next secret map!\n");
	}
}